

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bezier.cpp
# Opt level: O2

bool __thiscall ON_BezierCurve::SetCV(ON_BezierCurve *this,int i,ON_4dPoint *point)

{
  double *pdVar1;
  double dVar2;
  uint uVar3;
  bool bVar4;
  double dVar5;
  
  if (this->m_cv == (double *)0x0) {
    bVar4 = false;
  }
  else {
    pdVar1 = this->m_cv + (long)i * (long)this->m_cv_stride;
    if (this->m_is_rat == 0) {
      dVar2 = point->w;
      bVar4 = (bool)(-(dVar2 != 0.0) & 1);
      dVar5 = 1.0 / dVar2;
      if ((dVar2 == 0.0) && (!NAN(dVar2))) {
        dVar5 = 1.0;
      }
      *pdVar1 = point->x * dVar5;
      uVar3 = this->m_dim;
      if (((1 < (int)uVar3) && (pdVar1[1] = point->y * dVar5, uVar3 != 2)) &&
         (pdVar1[2] = dVar5 * point->z, 3 < uVar3)) {
        memset(pdVar1 + 3,0,(ulong)(uVar3 - 3) << 3);
      }
    }
    else {
      *pdVar1 = point->x;
      uVar3 = this->m_dim;
      if (1 < (int)uVar3) {
        pdVar1[1] = point->y;
        if (uVar3 == 2) {
          uVar3 = 2;
        }
        else {
          pdVar1[2] = point->z;
          if (uVar3 < 4) {
            uVar3 = 3;
          }
          else {
            memset(pdVar1 + 3,0,(ulong)(uVar3 - 3) << 3);
            uVar3 = this->m_dim;
          }
        }
      }
      pdVar1[(int)uVar3] = point->w;
      bVar4 = true;
    }
  }
  return bVar4;
}

Assistant:

double* ON_BezierCurve::CV( int i ) const
{
  return m_cv ? m_cv + (i*m_cv_stride) : 0;
}